

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

bool __thiscall QPDF::read_xrefEntry(QPDF *this,qpdf_offset_t *f1,int *f2,char *type)

{
  char *pcVar1;
  char cVar2;
  long *plVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  array<char,_21UL> line;
  
  plVar3 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  lVar5 = (**(code **)(*plVar3 + 0x38))(plVar3,&line,0x14);
  uVar7 = 0;
  bVar4 = false;
  if (lVar5 == 0x14) {
    line._M_elems[0x14] = '\0';
    for (pcVar6 = line._M_elems + 3; bVar8 = ((array<char,_21UL> *)(pcVar6 + -3))->_M_elems[0],
        bVar8 == 0x30; pcVar6 = pcVar6 + 1) {
      uVar7 = uVar7 + 1;
    }
    lVar5 = *f1;
    while ((byte)(bVar8 - 0x30) < 10) {
      if (9 < uVar7) {
        uVar7 = uVar7 + 1;
        break;
      }
      lVar5 = lVar5 * 10 + (ulong)bVar8 + -0x30;
      *f1 = lVar5;
      pcVar1 = pcVar6 + -2;
      pcVar6 = pcVar6 + 1;
      uVar7 = uVar7 + 1;
      bVar8 = *pcVar1;
    }
    bVar4 = false;
    if ((bVar8 < 0x21) && (bVar4 = false, (0x100003e00U >> ((ulong)bVar8 & 0x3f) & 1) != 0)) {
      uVar9 = 0xffffffff;
      do {
        bVar8 = pcVar6[-2];
        pcVar6 = pcVar6 + 1;
        uVar9 = uVar9 + 1;
      } while (bVar8 == 0x30);
      iVar10 = *f2;
      while ((byte)(bVar8 - 0x30) < 10) {
        if (4 < uVar9) {
          uVar9 = uVar9 + 1;
          break;
        }
        *f2 = iVar10 * 10;
        iVar10 = (int)pcVar6[-3] + iVar10 * 10 + -0x30;
        *f2 = iVar10;
        pcVar1 = pcVar6 + -2;
        pcVar6 = pcVar6 + 1;
        uVar9 = uVar9 + 1;
        bVar8 = *pcVar1;
      }
      if ((((((0x20 < bVar8) || ((0x100003e00U >> ((ulong)bVar8 & 0x3f) & 1) == 0)) ||
            ((byte)(pcVar6[-2] | 8U) != 0x6e)) ||
           ((*type = pcVar6[-2], pcVar6[-1] == '\0' || (cVar2 = *pcVar6, cVar2 == '\0')))) ||
          ((cVar2 != '\n' && (cVar2 != '\r')))) || ((uVar7 != 10 || (bVar4 = true, uVar9 != 5)))) {
        bVar4 = read_bad_xrefEntry(this,f1,f2,type);
      }
    }
  }
  return bVar4;
}

Assistant:

bool
QPDF::read_xrefEntry(qpdf_offset_t& f1, int& f2, char& type)
{
    std::array<char, 21> line;
    if (m->file->read(line.data(), 20) != 20) {
        // C++20: [[unlikely]]
        return false;
    }
    line[20] = '\0';
    char const* p = line.data();

    int f1_len = 0;
    int f2_len = 0;

    // is_space and is_digit both return false on '\0', so this will not overrun the null-terminated
    // buffer.

    // Gather f1 digits. NB No risk of overflow as 9'999'999'999 < max long long.
    while (*p == '0') {
        ++f1_len;
        ++p;
    }
    while (util::is_digit(*p) && f1_len++ < 10) {
        f1 *= 10;
        f1 += *p++ - '0';
    }
    // Require space
    if (!util::is_space(*p++)) {
        // Entry doesn't start with space or digit.
        // C++20: [[unlikely]]
        return false;
    }
    // Gather digits. NB No risk of overflow as 99'999 < max int.
    while (*p == '0') {
        ++f2_len;
        ++p;
    }
    while (util::is_digit(*p) && f2_len++ < 5) {
        f2 *= 10;
        f2 += static_cast<int>(*p++ - '0');
    }
    if (util::is_space(*p++) && (*p == 'f' || *p == 'n')) {
        // C++20: [[likely]]
        type = *p;
        // No test for valid line[19].
        if (*(++p) && *(++p) && (*p == '\n' || *p == '\r') && f1_len == 10 && f2_len == 5) {
            // C++20: [[likely]]
            return true;
        }
    }
    return read_bad_xrefEntry(f1, f2, type);
}